

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O0

int Lpk_NodeCuts(Lpk_Man_t *p)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Lpk_Cut_t *pLVar4;
  int fChanges;
  int nMffc;
  int Temp;
  int k;
  int i;
  Lpk_Cut_t *pCut2;
  Lpk_Cut_t *pCut;
  Lpk_Man_t *p_local;
  
  Vec_PtrClear(p->vTemp);
  iVar2 = Abc_NodeMffcLabel(p->pObj,p->vTemp);
  p->nMffc = iVar2;
  if (iVar2 < 1) {
    __assert_fail("nMffc > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                  ,0x274,"int Lpk_NodeCuts(Lpk_Man_t *)");
  }
  if (iVar2 == 1) {
    p_local._4_4_ = 0;
  }
  else {
    pLVar4 = p->pCuts;
    p->nCuts = 1;
    *(uint *)pLVar4 = *(uint *)pLVar4 & 0xfffff03f;
    *(uint *)pLVar4 = *(uint *)pLVar4 & 0xfffc0fff;
    *(uint *)pLVar4 = *(uint *)pLVar4 & 0xffffffc0 | 1;
    p->pCuts[0].pLeaves[0] = p->pObj->Id;
    Lpk_NodeCutSignature(pLVar4);
    for (Temp = 0; Temp < p->nCuts; Temp = Temp + 1) {
      pLVar4 = p->pCuts + Temp;
      if (((undefined1  [820])*pLVar4 & (undefined1  [820])0x3f) != (undefined1  [820])0x0) {
        nMffc = 0;
        while ((nMffc < (int)(*(uint *)pLVar4 & 0x3f) &&
               (Lpk_NodeCutsOne(p,pLVar4,pLVar4->pLeaves[nMffc]), p->nCuts != 10000))) {
          nMffc = nMffc + 1;
        }
        if (p->nCuts == 10000) break;
      }
    }
    if (p->nCuts == 10000) {
      p->nNodesOver = p->nNodesOver + 1;
    }
    if (p->pPars->fSatur != 0) {
      Lpk_NodeRecordImpact(p);
    }
    p->nEvals = 0;
    for (Temp = 0; Temp < p->nCuts; Temp = Temp + 1) {
      pLVar4 = p->pCuts + Temp;
      if (1 < (*(uint *)pLVar4 & 0x3f)) {
        uVar3 = Lpk_LutNumLuts(*(uint *)pLVar4 & 0x3f,p->pPars->nLutSize);
        *(uint *)pLVar4 = *(uint *)pLVar4 & 0xff03ffff | (uVar3 & 0x3f) << 0x12;
        pLVar4->Weight =
             ((float)(int)((*(uint *)pLVar4 >> 6 & 0x3f) - (*(uint *)pLVar4 >> 0xc & 0x3f)) * 1.0) /
             (float)(*(uint *)pLVar4 >> 0x12 & 0x3f);
        if (1.001 < pLVar4->Weight) {
          uVar3 = Lpk_NodeCutsCheckDsd(p,pLVar4);
          *(uint *)pLVar4 = *(uint *)pLVar4 & 0xbfffffff | (uVar3 & 1) << 0x1e;
          if ((*(uint *)pLVar4 >> 0x1e & 1) == 0) {
            iVar2 = p->nEvals;
            p->nEvals = iVar2 + 1;
            p->pEvals[iVar2] = Temp;
          }
        }
      }
    }
    if (p->nEvals == 0) {
      p_local._4_4_ = 0;
    }
    else {
      do {
        bVar1 = false;
        for (Temp = 0; Temp < p->nEvals + -1; Temp = Temp + 1) {
          if (p->pCuts[p->pEvals[Temp]].Weight < p->pCuts[p->pEvals[Temp + 1]].Weight - 0.001) {
            iVar2 = p->pEvals[Temp];
            p->pEvals[Temp] = p->pEvals[Temp + 1];
            p->pEvals[Temp + 1] = iVar2;
            bVar1 = true;
          }
        }
      } while (bVar1);
      p_local._4_4_ = 1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Lpk_NodeCuts( Lpk_Man_t * p )
{
    Lpk_Cut_t * pCut, * pCut2;
    int i, k, Temp, nMffc, fChanges;
    //int nSupp;

    // mark the MFFC of the node with the current trav ID
    Vec_PtrClear( p->vTemp );
    nMffc = p->nMffc = Abc_NodeMffcLabel( p->pObj, p->vTemp );
    assert( nMffc > 0 );
    if ( nMffc == 1 )
        return 0;
/*
    // count the leaves
    nSupp = Lpk_CountSupp( p->pNtk, p->vTemp );
    if ( nMffc > 10 && nSupp <= 10 )
        printf( "Obj = %4d : Supp = %4d. Mffc = %4d.\n", p->pObj->Id, nSupp, nMffc );
*/
    // initialize the first cut
    pCut = p->pCuts; p->nCuts = 1;
    pCut->nNodes = 0; 
    pCut->nNodesDup = 0;
    pCut->nLeaves = 1;
    pCut->pLeaves[0] = p->pObj->Id;
    // assign the signature
    Lpk_NodeCutSignature( pCut );

    // perform the cut computation
    for ( i = 0; i < p->nCuts; i++ )
    {
        pCut = p->pCuts + i;
        if ( pCut->nLeaves == 0 )
            continue;

        // try to expand the fanins of this cut
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
        {
            // create a new cut
            Lpk_NodeCutsOne( p, pCut, pCut->pLeaves[k] );
            // quit if the number of cuts has exceeded the limit
            if ( p->nCuts == LPK_CUTS_MAX )
                break;
        }
        if ( p->nCuts == LPK_CUTS_MAX )
            break;
    }
    if ( p->nCuts == LPK_CUTS_MAX ) 
        p->nNodesOver++;

    // record the impact of this node
    if ( p->pPars->fSatur )
        Lpk_NodeRecordImpact( p );

    // compress the cuts by removing empty ones, those with negative Weight, and decomposable ones
    p->nEvals = 0;
    for ( i = 0; i < p->nCuts; i++ )
    {
        pCut = p->pCuts + i;
        if ( pCut->nLeaves < 2 )
            continue;
        // compute the minimum number of LUTs needed to implement this cut
        // V = N * (K-1) + 1  ~~~~~  N = Ceiling[(V-1)/(K-1)] = (V-1)/(K-1) + [(V-1)%(K-1) > 0]
        pCut->nLuts = Lpk_LutNumLuts( pCut->nLeaves, p->pPars->nLutSize ); 
//        pCut->Weight = (float)1.0 * (pCut->nNodes - pCut->nNodesDup - 1) / pCut->nLuts; //p->pPars->nLutsMax;
        pCut->Weight = (float)1.0 * (pCut->nNodes - pCut->nNodesDup) / pCut->nLuts; //p->pPars->nLutsMax;
        if ( pCut->Weight <= 1.001 )
//        if ( pCut->Weight <= 0.999 )
            continue;
        pCut->fHasDsd = Lpk_NodeCutsCheckDsd( p, pCut );
        if ( pCut->fHasDsd )
            continue;
        p->pEvals[p->nEvals++] = i;

//        if ( pCut->nLeaves <= 9 && pCut->nNodes > 15 )
//        printf( "%5d : Obj = %4d  Leaves = %4d  Nodes = %4d  LUTs = %4d\n", i, p->pObj->Id, pCut->nLeaves, pCut->nNodes, pCut->nLuts );
    }
    if ( p->nEvals == 0 )
        return 0;

    // sort the cuts by Weight
    do {
        fChanges = 0;
        for ( i = 0; i < p->nEvals - 1; i++ )
        {
            pCut = p->pCuts + p->pEvals[i];
            pCut2 = p->pCuts + p->pEvals[i+1];
            if ( pCut->Weight >= pCut2->Weight - 0.001 )
                continue;
            Temp = p->pEvals[i];
            p->pEvals[i] = p->pEvals[i+1];
            p->pEvals[i+1] = Temp;
            fChanges = 1;
        }
    } while ( fChanges );
/*
    for ( i = 0; i < p->nEvals; i++ )
    {
        pCut = p->pCuts + p->pEvals[i];
        printf( "Cut %3d : W = %5.2f.\n", i, pCut->Weight );
    }
    printf( "\n" );
*/
    return 1;
}